

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O1

Pass * wasm::createGenerateI64DynCallsPass(void)

{
  Pass *pPVar1;
  
  pPVar1 = (Pass *)operator_new(0x188);
  pPVar1->runner = (PassRunner *)0x0;
  (pPVar1->name)._M_dataplus._M_p = (pointer)&(pPVar1->name).field_2;
  (pPVar1->name)._M_string_length = 0;
  (pPVar1->name).field_2._M_local_buf[0] = '\0';
  (pPVar1->passArg).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  pPVar1[1]._vptr_Pass = (_func_int **)0x0;
  pPVar1[1].runner = (PassRunner *)0x0;
  pPVar1[3]._vptr_Pass = (_func_int **)0x0;
  pPVar1[3].runner = (PassRunner *)0x0;
  pPVar1[3].name._M_dataplus._M_p = (pointer)0x0;
  pPVar1[3].name._M_string_length = 0;
  pPVar1[3].name.field_2._M_allocated_capacity = 0;
  pPVar1->_vptr_Pass = (_func_int **)&PTR__GenerateDynCalls_010923e0;
  pPVar1[3].name.field_2._M_local_buf[8] = '\x01';
  pPVar1[3].passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (pointer)&pPVar1[4].runner;
  pPVar1[3].passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 1;
  *(undefined8 *)
   ((long)&pPVar1[3].passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x10) = 0;
  *(undefined8 *)
   ((long)&pPVar1[3].passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x18) = 0;
  *(undefined4 *)
   &pPVar1[3].passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = 0x3f800000;
  pPVar1[4]._vptr_Pass = (_func_int **)0x0;
  pPVar1[4].runner = (PassRunner *)0x0;
  pPVar1[4].name._M_string_length = (size_type)&pPVar1[4].name;
  pPVar1[4].name._M_dataplus._M_p = (pointer)&pPVar1[4].name;
  pPVar1[4].name.field_2._M_allocated_capacity = 0;
  return pPVar1;
}

Assistant:

Pass* createGenerateI64DynCallsPass() { return new GenerateDynCalls(true); }